

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::MemInvalidate(CodeGenGenericContext *this,x86Argument *address)

{
  x86Reg xVar1;
  x86Reg xVar2;
  x86Reg xVar3;
  uint uVar4;
  x86Reg xVar5;
  MemCache *pMVar6;
  long lVar7;
  
  pMVar6 = this->memCache;
  xVar1 = address->ptrIndex;
  lVar7 = 0;
  do {
    if (lVar7 == 0x10) {
      return;
    }
    if ((pMVar6->address).type != argNone) {
      xVar2 = (pMVar6->address).ptrIndex;
      if ((xVar1 == rNONE) && (address->ptrBase == rEBX)) {
        if ((xVar2 == rNONE) && ((pMVar6->address).ptrBase == rEBX)) {
          xVar2 = (address->field_1).reg;
          if (xVar2 == rNONE) {
            __assert_fail("address.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x80,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
          }
          xVar3 = (pMVar6->address).field_1.reg;
          if (xVar3 == rNONE) {
            __assert_fail("write.ptrSize != sNONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                          ,0x81,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
          }
          xVar5 = (uint)(xVar2 != rECX) * 4 + rEDX;
          if (xVar2 < rECX) {
            xVar5 = xVar2;
          }
          xVar2 = (uint)(xVar3 != rECX) * 4 + rEDX;
          if (xVar3 < rECX) {
            xVar2 = xVar3;
          }
          uVar4 = (pMVar6->address).ptrNum;
          if ((uVar4 < xVar5 + address->ptrNum) && ((uint)address->ptrNum < uVar4 + xVar2))
          goto LAB_001b7a56;
        }
      }
      else if ((xVar2 != rNONE) || ((pMVar6->address).ptrBase != rEBX)) {
LAB_001b7a56:
        (pMVar6->address).type = argNone;
        (pMVar6->value).type = argNone;
        uVar4 = this->memCacheFreeSlotCount;
        if (0xf < (ulong)uVar4) {
          __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x8d,"void CodeGenGenericContext::MemInvalidate(const x86Argument &)");
        }
        this->memCacheFreeSlotCount = uVar4 + 1;
        this->memCacheFreeSlots[uVar4] = (uint)lVar7;
      }
    }
    lVar7 = lVar7 + 1;
    pMVar6 = pMVar6 + 1;
  } while( true );
}

Assistant:

void CodeGenGenericContext::MemInvalidate(const x86Argument &address)
{
	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.address.type == x86Argument::argNone)
			continue;

		x86Argument &write = entry.address;

		// Reading from register file can't mark any memory writes with addresses from other registers since they can't point to it
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && (write.ptrIndex != rNONE || write.ptrBase != rEBX))
			continue;

		// Reading from an address in a register different from register file can't mark writes to register file as read
		if((address.ptrIndex != rNONE || address.ptrBase != rEBX) && write.ptrIndex == rNONE && write.ptrBase == rEBX)
			continue;

		// When reading and writing from register file, check read range intersection with write range
		if(address.ptrIndex == rNONE && address.ptrBase == rEBX && write.ptrIndex == rNONE && write.ptrBase == rEBX)
		{
			assert(address.ptrSize != sNONE);
			assert(write.ptrSize != sNONE);

			unsigned readSize = address.ptrSize == sBYTE ? 1 : (address.ptrSize == sWORD ? 2 : (address.ptrSize == sDWORD ? 4 : 8));
			unsigned writeSize = write.ptrSize == sBYTE ? 1 : (write.ptrSize == sWORD ? 2 : (write.ptrSize == sDWORD ? 4 : 8));

			if(unsigned(address.ptrNum) + readSize <= unsigned(write.ptrNum) || unsigned(address.ptrNum) >= unsigned(write.ptrNum) + writeSize)
				continue;
		}

		entry.address.type = x86Argument::argNone;
		entry.value.type = x86Argument::argNone;

		assert(memCacheFreeSlotCount < memoryStateSize);
		memCacheFreeSlots[memCacheFreeSlotCount++] = i;
	}
}